

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O0

void __thiscall
wmj::fileWatcher::fileWatcher::fileWatcher
          (fileWatcher *this,string *fileName,function<void_()> *call_back)

{
  int iVar1;
  function<void_()> *call_back_local;
  string *fileName_local;
  fileWatcher *this_local;
  
  this->_vptr_fileWatcher = (_func_int **)&PTR__fileWatcher_00108d80;
  iVar1 = inotify_init();
  this->inotify_fd = iVar1;
  std::__cxx11::string::string((string *)&this->file_name,(string *)fileName);
  this->need_watching = true;
  std::function<void_()>::function(&this->call_back_func);
  std::function<void_()>::operator=(&this->call_back_func,call_back);
  return;
}

Assistant:

fileWatcher::fileWatcher(const std::string &fileName,
                         const std::function<void(void)> &call_back):
    inotify_fd(inotify_init()), file_name(fileName), need_watching(true) {
    this->call_back_func = call_back;
}